

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::BeginReadDictionary
          (ON_BinaryArchive *this,ON_UUID *dictionary_id,uint *version,ON_wString *dictionary_name)

{
  bool bVar1;
  bool bVar2;
  int major_version;
  int minor_version;
  ON_UUID id;
  int local_48 [2];
  ON_UUID local_40;
  
  local_48[0] = 0;
  local_48[1] = 0;
  bVar1 = BeginRead3dmChunk(this,0x40008010,local_48,local_48 + 1);
  if (bVar1) {
    bVar1 = local_48[0] == 1;
    if ((bVar1) && (bVar1 = BeginRead3dmChunk(this,0x40008011,local_48,local_48 + 1), bVar1)) {
      bVar2 = local_48[0] == 1;
      if ((bVar2) && (bVar2 = ReadUuid(this,&local_40), bVar2)) {
        if (dictionary_id != (ON_UUID *)0x0) {
          dictionary_id->Data1 = local_40.Data1;
          dictionary_id->Data2 = local_40.Data2;
          dictionary_id->Data3 = local_40.Data3;
          *&dictionary_id->Data4 = local_40.Data4;
        }
        bVar2 = ReadInt32(this,1,(ON__INT32 *)version);
        if (bVar2) {
          bVar2 = ReadString(this,dictionary_name);
        }
      }
      bVar1 = EndRead3dmChunk(this,false);
      bVar1 = (bool)(bVar1 & bVar2);
    }
    if (bVar1 == false) {
      EndRead3dmChunk(this,false);
    }
  }
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::BeginReadDictionary(
        ON_UUID* dictionary_id,
        unsigned int* version,
        ON_wString& dictionary_name
        )
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = BeginRead3dmChunk(TCODE_DICTIONARY,&major_version,&minor_version);
  if ( rc )
  {
    for(;;)
    {
      rc = (1 == major_version);
      if (!rc) break;

      // Read dictionary id chunk
      rc = BeginRead3dmChunk(TCODE_DICTIONARY_ID,&major_version,&minor_version);
      if ( !rc ) break;
      for(;;)
      {
        rc = (1==major_version);
        if (!rc) break;
        ON_UUID id;
        rc = ReadUuid(id);
        if (!rc) break;
        if ( dictionary_id )
          *dictionary_id = id;
        rc = ReadInt(version);
        if (!rc) break;
        rc = ReadString(dictionary_name);
        if (!rc) break;
        break;
      }
      if ( !EndRead3dmChunk() ) // TCODE_DICTIONARY_ID end
        rc = false;
      break;
    }

    if ( !rc )
      EndRead3dmChunk(); // TCODE_DICTIONARY end
  }
  return rc;
}